

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableProtoObjectWalker::GetGroupObject
          (RecyclableProtoObjectWalker *this,ResolvedObject *pResolvedObject)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  JavascriptLibrary *this_00;
  ObjectPrototypeObject *this_01;
  RecyclableObject *pRVar6;
  IDiagObjectModelDisplay *pIVar7;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *pAVar8;
  RecyclableProtoObjectAddress *this_02;
  RecyclableObject *local_90;
  TrackAllocData local_70;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *local_48;
  ArenaAllocator *arena;
  RecyclableObject *obj;
  ResolvedObject *pRStack_30;
  DBGPROP_ATTRIB_FLAGS defaultAttributes;
  ResolvedObject *pResolvedObject_local;
  RecyclableProtoObjectWalker *this_local;
  TypeId local_18;
  TypeId local_14;
  RecyclableObject *pRStack_10;
  TypeId typeId;
  
  pRStack_30 = pResolvedObject;
  pResolvedObject_local = (ResolvedObject *)this;
  if (pResolvedObject == (ResolvedObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd53,"(pResolvedObject)","pResolvedObject");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  obj._4_4_ = 0;
  this_00 = ScriptContext::GetLibrary((this->super_RecyclableObjectWalker).scriptContext);
  this_01 = JavascriptLibraryBase::GetObjectPrototypeObject(&this_00->super_JavascriptLibraryBase);
  bVar2 = ObjectPrototypeObject::is__proto__Enabled(this_01);
  if (bVar2) {
    pRStack_30->name = L"__proto__";
    pRStack_30->propId = 0x1eb;
  }
  else {
    pRStack_30->name = L"[prototype]";
    pRStack_30->propId = -1;
    obj._4_4_ = 0x20;
  }
  arena = (ArenaAllocator *)
          VarTo<Js::RecyclableObject>((this->super_RecyclableObjectWalker).instance);
  pRVar6 = RecyclableObject::GetPrototype((RecyclableObject *)arena);
  if (pRVar6 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd64,"(obj->GetPrototype() != nullptr)",
                                "obj->GetPrototype() != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar6 = RecyclableObject::GetPrototype((RecyclableObject *)arena);
  TVar3 = RecyclableObject::GetTypeId(pRVar6);
  if (TVar3 == TypeIds_Null) {
    pRVar6 = RecyclableObject::GetPrototype((RecyclableObject *)arena);
    TVar3 = RecyclableObject::GetTypeId(pRVar6);
    if (TVar3 == TypeIds_Null) {
      TVar3 = RecyclableObject::GetTypeId((RecyclableObject *)arena);
      if (TVar3 == TypeIds_UnscopablesWrapperObject) goto LAB_00c6f37c;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xd66,
                                "(obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject))"
                                ,
                                "obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject)"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
LAB_00c6f37c:
  pRVar6 = RecyclableObject::GetPrototype((RecyclableObject *)arena);
  pRStack_30->obj = pRVar6;
  if ((this->super_RecyclableObjectWalker).originalInstance == (Var)0x0) {
    local_90 = (RecyclableObject *)pRStack_30->obj;
  }
  else {
    local_90 = VarTo<Js::RecyclableObject>((this->super_RecyclableObjectWalker).originalInstance);
  }
  pRStack_30->originalObj = local_90;
  pRStack_30->scriptContext = (this->super_RecyclableObjectWalker).scriptContext;
  this_local = (RecyclableProtoObjectWalker *)pRStack_30->obj;
  if (this_local == (RecyclableProtoObjectWalker *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = TaggedInt::Is(this_local);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(this_local);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      pRStack_10 = UnsafeVarTo<Js::RecyclableObject>(this_local);
      if (pRStack_10 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      local_14 = RecyclableObject::GetTypeId(pRStack_10);
      if (0x57 < (int)local_14) {
        BVar4 = RecyclableObject::IsExternal(pRStack_10);
        if (BVar4 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
      local_18 = local_14;
    }
  }
  pRStack_30->typeId = local_18;
  local_48 = &GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext)->
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
  pIVar7 = ResolvedObject::CreateDisplay(pRStack_30);
  pRStack_30->objectDisplay = pIVar7;
  (*pRStack_30->objectDisplay->_vptr_IDiagObjectModelDisplay[6])
            (pRStack_30->objectDisplay,(ulong)obj._4_4_);
  pAVar8 = local_48;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_70,(type_info *)&RecyclableProtoObjectAddress::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
             ,0xd75);
  pAVar8 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo(pAVar8,&local_70);
  this_02 = (RecyclableProtoObjectAddress *)
            new<Memory::ArenaAllocator>(0x28,(ArenaAllocator *)pAVar8,0x3f67b0);
  RecyclableProtoObjectAddress::RecyclableProtoObjectAddress
            (this_02,(this->super_RecyclableObjectWalker).instance,0x124,pRStack_30->obj);
  pRStack_30->address = (IDiagObjectAddress *)this_02;
  return 1;
}

Assistant:

BOOL RecyclableProtoObjectWalker::GetGroupObject(ResolvedObject* pResolvedObject)
    {
        Assert(pResolvedObject);

        DBGPROP_ATTRIB_FLAGS defaultAttributes = DBGPROP_ATTRIB_NO_ATTRIB;
        if (scriptContext->GetLibrary()->GetObjectPrototypeObject()->is__proto__Enabled())
        {
            pResolvedObject->name           = _u("__proto__");
            pResolvedObject->propId         = PropertyIds::__proto__;
        }
        else
        {
            pResolvedObject->name           = _u("[prototype]");
            pResolvedObject->propId         = Constants::NoProperty; // This property will not be editable.
            defaultAttributes               = DBGPROP_ATTRIB_VALUE_IS_FAKE;
        }

        RecyclableObject *obj               = Js::VarTo<Js::RecyclableObject>(instance);

        Assert(obj->GetPrototype() != nullptr);
        //UnscopablesWrapperObjects prototype is null
        Assert(obj->GetPrototype()->GetTypeId() != TypeIds_Null || (obj->GetPrototype()->GetTypeId() == TypeIds_Null && obj->GetTypeId() == TypeIds_UnscopablesWrapperObject));

        pResolvedObject->obj                = obj->GetPrototype();
        pResolvedObject->originalObj        = (originalInstance != nullptr) ? Js::VarTo<Js::RecyclableObject>(originalInstance) : pResolvedObject->obj;
        pResolvedObject->scriptContext      = scriptContext;
        pResolvedObject->typeId             = JavascriptOperators::GetTypeId(pResolvedObject->obj);

        ArenaAllocator * arena = GetArenaFromContext(scriptContext);
        pResolvedObject->objectDisplay      = pResolvedObject->CreateDisplay();
        pResolvedObject->objectDisplay->SetDefaultTypeAttribute(defaultAttributes);

        pResolvedObject->address = Anew(arena,
            RecyclableProtoObjectAddress,
            instance,
            PropertyIds::prototype,
            pResolvedObject->obj);

        return TRUE;
    }